

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

String * __thiscall
dxil_spv::get_string_metadata_abi_cxx11_
          (String *__return_storage_ptr__,dxil_spv *this,MDNode *node,uint index)

{
  pointer pcVar1;
  MetadataKind MVar2;
  MDString *this_00;
  String *pSVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  char acStack_1018 [4104];
  
  this_00 = (MDString *)LLVMBC::MDNode::getOperand((MDNode *)this,(uint)node);
  MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this_00);
  if (MVar2 == String) {
    pSVar3 = LLVMBC::MDString::getString_abi_cxx11_(this_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pSVar3->_M_dataplus)._M_p;
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                         *)__return_storage_ptr__,pcVar1,pcVar1 + pSVar3->_M_string_length);
    return __return_storage_ptr__;
  }
  p_Var4 = get_thread_log_callback();
  if (p_Var4 == (LoggingCallback)0x0) {
    get_string_metadata_abi_cxx11_();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,acStack_1018);
  std::terminate();
}

Assistant:

static String get_string_metadata(const llvm::MDNode *node, unsigned index)
{
#ifdef HAVE_LLVMBC
	return llvm::cast<llvm::MDString>(node->getOperand(index))->getString();
#else
	std::string tmp = llvm::cast<llvm::MDString>(node->getOperand(index))->getString();
	String str(tmp.begin(), tmp.end());
	return str;
#endif
}